

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.h
# Opt level: O1

void llvm::object_deleter<(anonymous_namespace)::FilesToRemoveCleanup>::call(void *Ptr)

{
  FileToRemoveList *this;
  
  this = (anonymous_namespace)::FilesToRemove;
  if (Ptr != (void *)0x0) {
    LOCK();
    (anonymous_namespace)::FilesToRemove = (FileToRemoveList *)0x0;
    UNLOCK();
    if (this != (FileToRemoveList *)0x0) {
      anon_unknown.dwarf_e734c::FileToRemoveList::~FileToRemoveList(this);
      operator_delete(this,0x10);
    }
    operator_delete(Ptr,1);
    return;
  }
  return;
}

Assistant:

static void call(void *Ptr) { delete (T *)Ptr; }